

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_chacha20_poly1305.c
# Opt level: O0

void * chacha20_poly1305_newctx(void *provctx)

{
  int iVar1;
  PROV_CHACHA20_CTX *ctx_00;
  PROV_CIPHER_HW *flags;
  void *in_RDI;
  PROV_CIPHER_HW *unaff_retaddr;
  void *in_stack_00000008;
  PROV_CHACHA20_POLY1305_CTX *ctx;
  undefined8 in_stack_ffffffffffffffd0;
  int line;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  PROV_CHACHA20_CTX *local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_8 = (PROV_CHACHA20_CTX *)0x0;
  }
  else {
    ctx_00 = (PROV_CHACHA20_CTX *)
             CRYPTO_zalloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,line);
    local_8 = ctx_00;
    if (ctx_00 != (PROV_CHACHA20_CTX *)0x0) {
      flags = ossl_prov_cipher_hw_chacha20_poly1305(0x100);
      ossl_cipher_generic_initkey
                (in_RDI,(size_t)local_8,(size_t)ctx_00,(size_t)in_stack_ffffffffffffffd8,0,
                 (uint64_t)flags,unaff_retaddr,in_stack_00000008);
      *(undefined8 *)((long)&local_8[2].key + 0x10) = 0xc;
      *(undefined8 *)((long)&local_8[2].key + 0x18) = 0xffffffffffffffff;
      ossl_chacha20_initctx(ctx_00);
    }
  }
  return local_8;
}

Assistant:

static void *chacha20_poly1305_newctx(void *provctx)
{
    PROV_CHACHA20_POLY1305_CTX *ctx;

    if (!ossl_prov_is_running())
        return NULL;

    ctx = OPENSSL_zalloc(sizeof(*ctx));
    if (ctx != NULL) {
        ossl_cipher_generic_initkey(&ctx->base, CHACHA20_POLY1305_KEYLEN * 8,
                                    CHACHA20_POLY1305_BLKLEN * 8,
                                    CHACHA20_POLY1305_IVLEN * 8,
                                    CHACHA20_POLY1305_MODE,
                                    CHACHA20_POLY1305_FLAGS,
                                    ossl_prov_cipher_hw_chacha20_poly1305(
                                        CHACHA20_POLY1305_KEYLEN * 8),
                                    NULL);
        ctx->nonce_len = CHACHA20_POLY1305_IVLEN;
        ctx->tls_payload_length = NO_TLS_PAYLOAD_LENGTH;
        ossl_chacha20_initctx(&ctx->chacha);
    }
    return ctx;
}